

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

Edge __thiscall
geometrycentral::surface::SurfaceMesh::separateToNewEdge
          (SurfaceMesh *this,Halfedge heA,Halfedge heB)

{
  bool bVar1;
  pointer puVar2;
  pointer puVar3;
  runtime_error *this_00;
  ParentMeshT *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ParentMeshT *pPVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  unsigned_long uVar14;
  ulong uVar15;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> EVar16;
  unsigned_long uVar8;
  
  uVar15 = heB.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           ind;
  pPVar4 = heB.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           mesh;
  uVar6 = heA.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind;
  pPVar9 = heA.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           mesh;
  if (this->useImplicitTwinFlag == true) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,
               "Cannot separate edge from manifold mesh; all are already manifold. Try general SurfaceMesh."
              );
  }
  else {
    bVar1 = pPVar9->useImplicitTwinFlag;
    if (bVar1 == true) {
      uVar5 = uVar6 >> 1;
    }
    else {
      uVar5 = (pPVar9->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar6];
    }
    if (pPVar4->useImplicitTwinFlag == true) {
      uVar7 = uVar15 >> 1;
    }
    else {
      uVar7 = (pPVar4->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar15];
    }
    if (uVar5 == uVar7) {
      if (uVar6 != uVar15) {
        if (bVar1 == false) {
          uVar5 = (pPVar9->heEdgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6];
          uVar7 = (pPVar9->eHalfedgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5];
        }
        else {
          uVar5 = uVar6 >> 1;
          uVar7 = uVar6 & 0xfffffffffffffffe;
        }
        puVar2 = (pPVar9->heFaceArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = pPVar9->nFacesFillCount;
        uVar10 = uVar7;
        do {
          uVar11 = uVar10;
          if (puVar2[uVar10] < uVar12) break;
          if (bVar1 == false) {
            uVar10 = (pPVar9->heSiblingArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10];
          }
          else {
            uVar10 = uVar10 ^ 1;
          }
          uVar11 = uVar7;
        } while (uVar10 != uVar7);
        uVar10 = puVar2[uVar7];
        uVar13 = uVar7;
        while (uVar12 <= uVar10) {
          if (bVar1 == false) {
            uVar13 = (pPVar9->heSiblingArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
          }
          else {
            uVar13 = uVar13 ^ 1;
          }
          if (uVar13 == uVar7) {
            uVar13 = uVar7;
            if (uVar7 == uVar11) goto LAB_001629c2;
            break;
          }
          uVar10 = puVar2[uVar13];
        }
        uVar7 = 0;
        do {
          if (bVar1 == false) {
            uVar13 = (pPVar9->heSiblingArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
          }
          else {
            uVar13 = uVar13 ^ 1;
          }
        } while ((uVar12 <= puVar2[uVar13]) || (uVar7 = uVar7 + 1, uVar13 != uVar11));
        if (uVar7 < 3) {
LAB_001629c2:
          EVar16.ind = uVar5;
          EVar16.mesh = pPVar9;
        }
        else {
          EVar16 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
                   getNewEdge(this);
          uVar8 = EVar16.ind;
          bVar1 = pPVar9->useImplicitTwinFlag;
          if (bVar1 == true) {
            uVar7 = uVar5 * 2;
            uVar12 = uVar7;
          }
          else {
            uVar7 = (pPVar9->eHalfedgeArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
            uVar12 = uVar7;
          }
          do {
            if (uVar7 != uVar15 && uVar7 != uVar6) {
              (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar5] = uVar7;
              break;
            }
            if (bVar1 == false) {
              uVar7 = (pPVar9->heSiblingArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
            }
            else {
              uVar7 = uVar7 ^ 1;
            }
          } while (uVar7 != uVar12);
          if (bVar1 == false) {
            uVar5 = (pPVar9->heSiblingArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar6];
            uVar7 = uVar5;
          }
          else {
            uVar5 = uVar6 ^ 1;
            uVar7 = uVar5;
          }
          do {
            while (uVar12 = uVar7, bVar1 != false) {
              if ((uVar12 ^ uVar6) == 1) goto LAB_00162a7b;
              uVar7 = uVar12 ^ 1;
            }
            uVar7 = (pPVar9->heSiblingArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12];
          } while (uVar7 != uVar6);
LAB_00162a7b:
          puVar2 = (this->heSiblingArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar2[uVar12] = uVar5;
          if (pPVar4->useImplicitTwinFlag == true) {
            uVar14 = uVar15 ^ 1;
            uVar5 = uVar14;
          }
          else {
            uVar14 = (pPVar4->heSiblingArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar15];
            uVar5 = uVar14;
          }
          do {
            while (uVar7 = uVar5, pPVar4->useImplicitTwinFlag != false) {
              if ((uVar7 ^ uVar15) == 1) goto LAB_00162ada;
              uVar5 = uVar7 ^ 1;
            }
            uVar5 = (pPVar4->heSiblingArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7];
          } while (uVar5 != uVar15);
LAB_00162ada:
          puVar2[uVar7] = uVar14;
          (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar8] = uVar6;
          puVar3 = (this->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3[uVar6] = uVar8;
          puVar3[uVar15] = uVar8;
          puVar2[uVar6] = uVar15;
          puVar2[uVar15] = uVar6;
          this->modificationTick = this->modificationTick + 1;
        }
        return (Edge)EVar16;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"halfedges must be distinct");
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"halfedges must be incident on same edge");
    }
  }
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Edge SurfaceMesh::separateToNewEdge(Halfedge heA, Halfedge heB) {
  if (usesImplicitTwin())
    throw std::runtime_error(
        "Cannot separate edge from manifold mesh; all are already manifold. Try general SurfaceMesh.");

  if (heA.edge() != heB.edge()) throw std::runtime_error("halfedges must be incident on same edge");
  if (heA == heB) throw std::runtime_error("halfedges must be distinct");

  // If theres <= 2 halfedges incident on the edge, we don't have any work to do.
  Edge e = heA.edge();
  if (e.degree() <= 2) return e;

  Edge newE = getNewEdge();

  // find some other halfedge incident on the old edge, make it e.halfedge()
  for (Halfedge he : e.adjacentHalfedges()) {
    if (he != heA && he != heB) {
      eHalfedgeArr[e.getIndex()] = he.getIndex();
      break;
    }
  }

  removeFromSiblingList(heA);
  removeFromSiblingList(heB);

  eHalfedgeArr[newE.getIndex()] = heA.getIndex();
  heEdgeArr[heA.getIndex()] = newE.getIndex();
  heEdgeArr[heB.getIndex()] = newE.getIndex();
  heSiblingArr[heA.getIndex()] = heB.getIndex();
  heSiblingArr[heB.getIndex()] = heA.getIndex();


  modificationTick++;
  return newE;
}